

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O0

void __thiscall pmt_tests::pmt_test1::test_method(pmt_test1 *this)

{
  bool bVar1;
  uint256 *puVar2;
  reference pvVar3;
  uint64_t uVar4;
  size_type sVar5;
  long in_FS_OFFSET;
  reference rVar6;
  int j_3;
  uint n;
  bool fInclude;
  uint j_2;
  int att;
  int nTx_;
  int nHeight;
  uint j_1;
  uint j;
  int i;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid2;
  DataStream ss;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid1;
  vector<uint256,_std::allocator<uint256>_> vTxid;
  CMutableTransaction tx;
  uint nTx;
  CPartialMerkleTreeTester pmt3;
  CPartialMerkleTreeTester pmt2;
  CPartialMerkleTree pmt1;
  vector<bool,_std::allocator<bool>_> vMatch;
  uint256 merkleRoot3;
  uint256 merkleRoot2;
  uint256 merkleRoot1;
  CBlock block;
  CTransaction *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  CPartialMerkleTreeTester *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  CBlock *in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  CPartialMerkleTree *in_stack_fffffffffffff938;
  const_string *in_stack_fffffffffffff940;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  lazy_ostream *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  CPartialMerkleTree *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96f;
  int local_5bc;
  uint local_5b0;
  int local_5ac;
  uint local_5a8;
  int local_5a4;
  uint local_5a0;
  uint local_590;
  int local_58c;
  const_string local_580 [2];
  assertion_result local_540 [2];
  const_string local_508;
  const_string local_4f0 [2];
  lazy_ostream local_4d0 [2];
  assertion_result local_4b0 [2];
  const_string local_478 [2];
  lazy_ostream local_458 [2];
  assertion_result local_438 [2];
  const_string local_400 [2];
  lazy_ostream local_3e0 [2];
  assertion_result local_3c0 [4];
  const_string local_358 [2];
  lazy_ostream local_338 [2];
  assertion_result local_318 [2];
  int local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  reference local_2b8;
  undefined1 local_28a;
  uint local_22c;
  uint local_224;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_58c = 0; local_58c < 0xc; local_58c = local_58c + 1) {
    local_224 = test_method::tx_counts[local_58c];
    CBlock::CBlock(in_stack_fffffffffffff928);
    for (local_590 = 0; local_590 < local_224; local_590 = local_590 + 1) {
      CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff908);
      local_22c = local_590;
      ::MakeTransactionRef<CMutableTransaction>
                ((CMutableTransaction *)
                 CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_fffffffffffff908,(value_type *)0x8f33db);
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff908);
      CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff908);
    }
    BlockMerkleRoot((CBlock *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                    (bool *)in_stack_fffffffffffff960);
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    uint256::uint256((uint256 *)in_stack_fffffffffffff908);
    std::allocator<uint256>::allocator((allocator<uint256> *)in_stack_fffffffffffff908);
    std::vector<uint256,_std::allocator<uint256>_>::vector
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff938,
               CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (value_type *)in_stack_fffffffffffff928,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    std::allocator<uint256>::~allocator((allocator<uint256> *)in_stack_fffffffffffff908);
    for (local_5a0 = 0; local_5a0 < local_224; local_5a0 = local_5a0 + 1) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffff918,
                   CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff908);
      CTransaction::GetHash(in_stack_fffffffffffff908);
      puVar2 = transaction_identifier::operator_cast_to_uint256_
                         ((transaction_identifier<false> *)in_stack_fffffffffffff908);
      pvVar3 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                         ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                          CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
      *(undefined8 *)(pvVar3->super_base_blob<256U>).m_data._M_elems =
           *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
      *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 8) =
           *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
      *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x10) =
           *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
      *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x18) =
           *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    }
    local_5a4 = 1;
    for (local_5a8 = local_224; 1 < (int)local_5a8; local_5a8 = (int)(local_5a8 + 1) / 2) {
      local_5a4 = local_5a4 + 1;
    }
    for (local_5ac = 1; local_5ac < 0xf; local_5ac = local_5ac + 1) {
      local_28a = 0;
      std::allocator<bool>::allocator((allocator<bool> *)in_stack_fffffffffffff908);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff938,
                 CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                 (bool *)in_stack_fffffffffffff928,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      std::allocator<bool>::~allocator((allocator<bool> *)in_stack_fffffffffffff908);
      std::vector<uint256,_std::allocator<uint256>_>::vector
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff908);
      for (local_5b0 = 0; local_5b0 < local_224; local_5b0 = local_5b0 + 1) {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff928,
                           in_stack_fffffffffffff924);
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff918,
                           CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
        local_2b8 = rVar6;
        std::_Bit_reference::operator=
                  ((_Bit_reference *)in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
        if (uVar4 == 0) {
          std::vector<uint256,_std::allocator<uint256>_>::operator[]
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                     CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
          std::vector<uint256,_std::allocator<uint256>_>::push_back
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                     (value_type *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
        }
      }
      CPartialMerkleTree::CPartialMerkleTree
                ((CPartialMerkleTree *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)
                 ,(vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff950,
                 (vector<bool,_std::allocator<bool>_> *)
                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
      local_2c8 = 0;
      uStack_2c0 = 0;
      local_2d8 = 0;
      uStack_2d0 = 0;
      DataStream::DataStream((DataStream *)in_stack_fffffffffffff908);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffff918,
                 (CPartialMerkleTree *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910)
                );
      sVar5 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff908);
      local_2dc = (int)sVar5 * local_5a4 + 1;
      std::min<unsigned_int>
                ((uint *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 (uint *)in_stack_fffffffffffff908);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                   in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                   (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
        DataStream::size((DataStream *)in_stack_fffffffffffff918);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        in_stack_fffffffffffff908 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_318,local_338,local_358,0x51,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff908);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff908);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      CPartialMerkleTreeTester::CPartialMerkleTreeTester
                (in_stack_fffffffffffff918,
                 (FastRandomContext *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910))
      ;
      DataStream::operator>>
                ((DataStream *)in_stack_fffffffffffff918,
                 (CPartialMerkleTreeTester *)
                 CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
      std::vector<uint256,_std::allocator<uint256>_>::vector
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff908);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff908);
      CPartialMerkleTree::ExtractMatches
                (in_stack_fffffffffffff960,
                 (vector<uint256,_std::allocator<uint256>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff950);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                   in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                   (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
        ::operator==((base_blob<256U> *)in_stack_fffffffffffff918,
                     (base_blob<256U> *)
                     CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        in_stack_fffffffffffff908 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_3c0,local_3e0,local_400,0x5d,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff908);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff908);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                   in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                   (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
        base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffff918);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        in_stack_fffffffffffff908 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_438,local_458,local_478,0x5e,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff908);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff908);
        in_stack_fffffffffffff96f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff96f);
      do {
        in_stack_fffffffffffff960 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                   in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                   (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
        in_stack_fffffffffffff95f =
             std::operator==((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff938,
                             (vector<uint256,_std::allocator<uint256>_> *)
                             CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
        in_stack_fffffffffffff950 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff908);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                   (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (unsigned_long)in_stack_fffffffffffff908);
        in_stack_fffffffffffff908 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_4b0,local_4d0,local_4f0,0x61,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff908);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff908);
        in_stack_fffffffffffff94f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff94f);
      for (local_5bc = 0; local_5bc < 4; local_5bc = local_5bc + 1) {
        CPartialMerkleTreeTester::CPartialMerkleTreeTester
                  (in_stack_fffffffffffff918,
                   (CPartialMerkleTreeTester *)
                   CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
        CPartialMerkleTreeTester::Damage((CPartialMerkleTreeTester *)in_stack_fffffffffffff928);
        in_stack_fffffffffffff940 = &local_508;
        std::vector<uint256,_std::allocator<uint256>_>::vector
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff908);
        CPartialMerkleTree::ExtractMatches
                  (in_stack_fffffffffffff960,
                   (vector<uint256,_std::allocator<uint256>_> *)
                   CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff950)
        ;
        do {
          in_stack_fffffffffffff938 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                     (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                     (unsigned_long)in_stack_fffffffffffff908);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff908);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                     in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                     (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
          in_stack_fffffffffffff937 =
               ::operator!=((base_blob<256U> *)in_stack_fffffffffffff918,
                            (base_blob<256U> *)
                            CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff918,(bool)in_stack_fffffffffffff917);
          in_stack_fffffffffffff928 = (CBlock *)boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                     (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                     (unsigned_long)in_stack_fffffffffffff908);
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                     (basic_cstring<const_char> *)in_stack_fffffffffffff908);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff918,
                     (pointer)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                     (unsigned_long)in_stack_fffffffffffff908);
          in_stack_fffffffffffff908 = (CTransaction *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_540,(lazy_ostream *)&stack0xfffffffffffffaa0,local_580,0x69,CHECK,
                     CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_fffffffffffff908);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff908);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
          in_stack_fffffffffffff924 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff924);
        } while (bVar1);
        std::vector<uint256,_std::allocator<uint256>_>::~vector
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918);
        CPartialMerkleTreeTester::~CPartialMerkleTreeTester
                  ((CPartialMerkleTreeTester *)in_stack_fffffffffffff908);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff918);
      std::vector<uint256,_std::allocator<uint256>_>::~vector
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918);
      CPartialMerkleTreeTester::~CPartialMerkleTreeTester
                ((CPartialMerkleTreeTester *)in_stack_fffffffffffff908);
      DataStream::~DataStream((DataStream *)in_stack_fffffffffffff908);
      CPartialMerkleTree::~CPartialMerkleTree((CPartialMerkleTree *)in_stack_fffffffffffff908);
      std::vector<uint256,_std::allocator<uint256>_>::~vector
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff908);
    }
    std::vector<uint256,_std::allocator<uint256>_>::~vector
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918);
    CBlock::~CBlock((CBlock *)in_stack_fffffffffffff908);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(pmt_test1)
{
    static const unsigned int tx_counts[] = {1, 4, 7, 17, 56, 100, 127, 256, 312, 513, 1000, 4095};

    for (int i = 0; i < 12; i++) {
        unsigned int nTx = tx_counts[i];

        // build a block with some dummy transactions
        CBlock block;
        for (unsigned int j=0; j<nTx; j++) {
            CMutableTransaction tx;
            tx.nLockTime = j; // actual transaction data doesn't matter; just make the nLockTime's unique
            block.vtx.push_back(MakeTransactionRef(std::move(tx)));
        }

        // calculate actual merkle root and height
        uint256 merkleRoot1 = BlockMerkleRoot(block);
        std::vector<uint256> vTxid(nTx, uint256());
        for (unsigned int j=0; j<nTx; j++)
            vTxid[j] = block.vtx[j]->GetHash();
        int nHeight = 1, nTx_ = nTx;
        while (nTx_ > 1) {
            nTx_ = (nTx_+1)/2;
            nHeight++;
        }

        // check with random subsets with inclusion chances 1, 1/2, 1/4, ..., 1/128
        for (int att = 1; att < 15; att++) {
            // build random subset of txid's
            std::vector<bool> vMatch(nTx, false);
            std::vector<uint256> vMatchTxid1;
            for (unsigned int j=0; j<nTx; j++) {
                bool fInclude = m_rng.randbits(att / 2) == 0;
                vMatch[j] = fInclude;
                if (fInclude)
                    vMatchTxid1.push_back(vTxid[j]);
            }

            // build the partial merkle tree
            CPartialMerkleTree pmt1(vTxid, vMatch);

            // serialize
            DataStream ss{};
            ss << pmt1;

            // verify CPartialMerkleTree's size guarantees
            unsigned int n = std::min<unsigned int>(nTx, 1 + vMatchTxid1.size()*nHeight);
            BOOST_CHECK(ss.size() <= 10 + (258*n+7)/8);

            // deserialize into a tester copy
            CPartialMerkleTreeTester pmt2{m_rng};
            ss >> pmt2;

            // extract merkle root and matched txids from copy
            std::vector<uint256> vMatchTxid2;
            std::vector<unsigned int> vIndex;
            uint256 merkleRoot2 = pmt2.ExtractMatches(vMatchTxid2, vIndex);

            // check that it has the same merkle root as the original, and a valid one
            BOOST_CHECK(merkleRoot1 == merkleRoot2);
            BOOST_CHECK(!merkleRoot2.IsNull());

            // check that it contains the matched transactions (in the same order!)
            BOOST_CHECK(vMatchTxid1 == vMatchTxid2);

            // check that random bit flips break the authentication
            for (int j=0; j<4; j++) {
                CPartialMerkleTreeTester pmt3(pmt2);
                pmt3.Damage();
                std::vector<uint256> vMatchTxid3;
                uint256 merkleRoot3 = pmt3.ExtractMatches(vMatchTxid3, vIndex);
                BOOST_CHECK(merkleRoot3 != merkleRoot1);
            }
        }
    }
}